

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2MG.cpp
# Opt level: O0

int Storage::Disk::Disk2MG::open(char *__file,int __oflag,...)

{
  bool bVar1;
  undefined4 *puVar2;
  int *piVar3;
  stat *psVar4;
  ulong uVar5;
  DiskImageHolder<Storage::Disk::MacintoshIMG> *this;
  size_t in_RCX;
  FixedType local_144;
  DiskImageHolder<Storage::Disk::MacintoshIMG> *local_140;
  uint32_t local_134;
  uint32_t local_130;
  uint32_t data_size;
  uint32_t data_start;
  uint32_t flags;
  uint32_t format;
  uint16_t version;
  uint16_t header_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> creator;
  undefined1 local_f8 [8];
  FileHolder file;
  string *file_name_local;
  
  file.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)___oflag;
  FileHolder::FileHolder((FileHolder *)local_f8,___oflag,ReadWrite);
  bVar1 = FileHolder::check_signature((FileHolder *)local_f8,"2IMG",0);
  if (!bVar1) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0xfffffffe;
    __cxa_throw(puVar2,&Error::typeinfo,0);
  }
  FileHolder::read((FileHolder *)&format,(int)local_f8,(void *)0x4,in_RCX);
  flags._2_2_ = FileHolder::get16le((FileHolder *)local_f8);
  flags._0_2_ = FileHolder::get16le((FileHolder *)local_f8);
  data_start = FileHolder::get32le((FileHolder *)local_f8);
  data_size = FileHolder::get32le((FileHolder *)local_f8);
  FileHolder::seek((FileHolder *)local_f8,4,1);
  local_130 = FileHolder::get32le((FileHolder *)local_f8);
  local_134 = FileHolder::get32le((FileHolder *)local_f8);
  if ((local_134 == 0) &&
     (piVar3 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&format),
     *piVar3 == 0x464f4f57)) {
    psVar4 = FileHolder::stats((FileHolder *)local_f8);
    local_134 = (int)psVar4->st_size - (uint)flags._2_2_;
  }
  if ((flags._2_2_ < 0x40) ||
     (uVar5 = (ulong)flags._2_2_, psVar4 = FileHolder::stats((FileHolder *)local_f8),
     psVar4->st_size <= (long)uVar5)) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0xfffffffe;
    __cxa_throw(puVar2,&Error::typeinfo,0);
  }
  if (1 < (uint16_t)flags) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0xfffffffe;
    __cxa_throw(puVar2,&Error::typeinfo,0);
  }
  if (data_start != 0) {
    if (data_start == 1) {
      this = (DiskImageHolder<Storage::Disk::MacintoshIMG> *)operator_new(0x1d8);
      local_144 = GCR;
      DiskImageHolder<Storage::Disk::MacintoshIMG>::
      DiskImageHolder<std::__cxx11::string_const&,Storage::Disk::MacintoshIMG::FixedType,unsigned_int_const&,unsigned_int&>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      file.file_access_mutex_.super___mutex_base._M_mutex.__data.__list.__next,
                 &local_144,&local_130,&local_134);
      local_140 = this;
      std::
      variant<decltype(nullptr),Storage::Disk::DiskImageHolderBase*,Storage::MassStorage::MassStorageDevice*>
      ::
      variant<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>*,void,void,Storage::Disk::DiskImageHolderBase*,void>
                ((variant<decltype(nullptr),Storage::Disk::DiskImageHolderBase*,Storage::MassStorage::MassStorageDevice*>
                  *)__file,&local_140);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&format);
      FileHolder::~FileHolder((FileHolder *)local_f8);
      return (int)__file;
    }
    if (data_start != 2) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 0xfffffffe;
      __cxa_throw(puVar2,&Error::typeinfo,0);
    }
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 0xfffffffe;
  __cxa_throw(puVar2,&Error::typeinfo,0);
}

Assistant:

Disk2MG::DiskOrMassStorageDevice Disk2MG::open(const std::string &file_name) {
	FileHolder file(file_name);

	// Check the signature.
	if(!file.check_signature("2IMG")) throw Error::InvalidFormat;

	// Grab the creator, potential to fix the data size momentarily.
	const auto creator = file.read(4);

	// Grab the header size, version number and image format.
	const uint16_t header_size = file.get16le();
	const uint16_t version = file.get16le();
	const uint32_t format = file.get32le();
	const uint32_t flags = file.get32le();

	// Skip the number of ProDOS blocks; this is surely implicit from the data size?
	file.seek(4, SEEK_CUR);

	// Get the offset and size of the disk image data.
	const uint32_t data_start = file.get32le();
	uint32_t data_size = file.get32le();

	// Correct for the Sweet 16 emulator, which writes broken 2MGs.
	if(!data_size && !memcmp(creator.data(), "WOOF", 4)) {
		data_size = uint32_t(file.stats().st_size - header_size);
	}

	// Skipped:
	//
	//	four bytes, offset to comment
	//	four bytes, length of comment
	//	four bytes, offset to creator-specific data
	//	four bytes, length of creator-specific data
	//
	// (all of which relate to optional appendages).

	// Validate.
	if(header_size < 0x40 || header_size >= file.stats().st_size) {
		throw Error::InvalidFormat;
	}
	if(version > 1) {
		throw Error::InvalidFormat;
	}

	// TODO: based on format, instantiate a suitable disk image.
	switch(format) {
		default: throw Error::InvalidFormat;
		case 0:
			// TODO: DOS 3.3 sector order.
		break;
		case 1:
			// 'ProDOS order', which could still mean Macintosh-style (ie. not ProDOS, but whatever)
			// or Apple II-style. Try them both.
			try {
				return new DiskImageHolder<Storage::Disk::MacintoshIMG>(file_name, MacintoshIMG::FixedType::GCR, data_start, data_size);
			} catch(...) {}

			// TODO: Apple II-style.

			// Try a hard-disk image. For now this assumes: for an Apple IIe or GS.
			return new MassStorage::HDV(file_name, data_start, data_size);
		break;
		case 2:
			// TODO: NIB data (yuck!).
		break;
	}

	// So: maybe extend FileHolder to handle hiding the header before instantiating
	// a proper holder? Probably more valid than having each actual disk class do
	// its own range logic?
	(void)flags;

	throw Error::InvalidFormat;
	return nullptr;
}